

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::_::ChainPromiseNode::onReady(ChainPromiseNode *this,Event *event)

{
  int iVar1;
  PromiseNode *pPVar2;
  Event *event_local;
  ChainPromiseNode *this_local;
  
  iVar1 = *(int *)&(this->super_Event).field_0x24;
  if (iVar1 == 0) {
    this->onReadyEvent = event;
  }
  else {
    if (iVar1 != 1) {
      unreachable();
    }
    pPVar2 = Own<kj::_::PromiseNode>::operator->(&this->inner);
    (**pPVar2->_vptr_PromiseNode)(pPVar2,event);
  }
  return;
}

Assistant:

void ChainPromiseNode::onReady(Event* event) noexcept {
  switch (state) {
    case STEP1:
      onReadyEvent = event;
      return;
    case STEP2:
      inner->onReady(event);
      return;
  }
  KJ_UNREACHABLE;
}